

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_set_set_Test::ObjectTest_basic_set_set_Test(ObjectTest_basic_set_set_Test *this)

{
  ObjectTest_basic_set_set_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__ObjectTest_basic_set_set_Test_0080fc70;
  return;
}

Assistant:

TEST(ObjectTest, basic_set_set) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, std::set<bool>);
	OBJECT_BASIC_SET_TEST(obj, std::set<signed char>);
	OBJECT_BASIC_SET_TEST(obj, std::set<unsigned char>);
	OBJECT_BASIC_SET_TEST(obj, std::set<short>);
	OBJECT_BASIC_SET_TEST(obj, std::set<int>);
	OBJECT_BASIC_SET_TEST(obj, std::set<long>);
	OBJECT_BASIC_SET_TEST(obj, std::set<long long>);
	OBJECT_BASIC_SET_TEST(obj, std::set<intmax_t>);
	OBJECT_BASIC_SET_TEST(obj, std::set<float>);
	OBJECT_BASIC_SET_TEST(obj, std::set<double>);
	OBJECT_BASIC_SET_TEST(obj, std::set<long double>);
	OBJECT_BASIC_SET_TEST(obj, std::set<std::u8string>);
	OBJECT_BASIC_SET_TEST(obj, std::set<object>);
}